

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

bool __thiscall
cmCacheManager::LoadCache
          (cmCacheManager *this,string *path,bool internal,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  mapped_type *this_00;
  bool local_679;
  allocator local_631;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  allocator local_60a;
  allocator local_609;
  string local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  allocator local_5c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  allocator local_599;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  undefined1 local_518 [8];
  string message;
  undefined1 local_4f0 [8];
  string oldcwd;
  string currentcwd;
  string local_4a8;
  char *local_488;
  char *oldDir;
  string local_478;
  allocator local_451;
  string local_450;
  allocator local_429;
  string local_428;
  char *local_408;
  char *cminor;
  uint v;
  char *local_3d8;
  char *cmajor;
  string local_3c8;
  _Self local_3a8;
  _Self local_3a0;
  _Self local_398;
  _Self local_390;
  allocator local_381;
  string local_380;
  allocator local_359;
  string local_358;
  undefined1 local_338 [8];
  CacheEntry e;
  string helpString;
  string entryKey;
  string buffer;
  char *realbuffer;
  ifstream fin;
  string local_58 [8];
  string cacheFile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includes_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *excludes_local;
  bool internal_local;
  string *path_local;
  cmCacheManager *this_local;
  
  cacheFile.field_2._8_8_ = includes;
  std::__cxx11::string::string(local_58,(string *)path);
  std::__cxx11::string::operator+=(local_58,"/CMakeCache.txt");
  if (internal) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::clear(&this->Cache);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar4);
  if (bVar1) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&realbuffer,pcVar4,_S_in);
    bVar2 = std::ios::operator!((ios *)((long)&realbuffer + *(long *)(realbuffer + -0x18)));
    if ((bVar2 & 1) == 0) {
      std::__cxx11::string::string((string *)(entryKey.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(helpString.field_2._M_local_buf + 8));
      while (bVar1 = std::ios::operator_cast_to_bool
                               ((ios *)((long)&realbuffer + *(long *)(realbuffer + -0x18))), bVar1)
      {
        std::__cxx11::string::string((string *)&e.Initialized);
        CacheEntry::CacheEntry((CacheEntry *)local_338);
        cmsys::SystemTools::GetLineFromStream
                  ((istream *)&realbuffer,(string *)((long)&entryKey.field_2 + 8),(bool *)0x0,-1);
        buffer.field_2._8_8_ = std::__cxx11::string::c_str();
        while( true ) {
          bVar1 = false;
          if ((((*(char *)buffer.field_2._8_8_ != '0') &&
               (bVar1 = true, *(char *)buffer.field_2._8_8_ != ' ')) &&
              (bVar1 = true, *(char *)buffer.field_2._8_8_ != '\t')) &&
             (bVar1 = true, *(char *)buffer.field_2._8_8_ != '\r')) {
            bVar1 = *(char *)buffer.field_2._8_8_ == '\n';
          }
          if (!bVar1) break;
          buffer.field_2._8_8_ = buffer.field_2._8_8_ + 1;
        }
        if ((*(char *)buffer.field_2._8_8_ != '#') && (*(char *)buffer.field_2._8_8_ != '\0')) {
          while( true ) {
            bVar1 = false;
            if (*(char *)buffer.field_2._8_8_ == '/') {
              bVar1 = *(char *)(buffer.field_2._8_8_ + 1) == '/';
            }
            if (!bVar1) break;
            if ((*(char *)(buffer.field_2._8_8_ + 2) == '\\') &&
               (*(char *)(buffer.field_2._8_8_ + 3) == 'n')) {
              std::__cxx11::string::operator+=((string *)&e.Initialized,"\n");
              std::__cxx11::string::operator+=
                        ((string *)&e.Initialized,(char *)(buffer.field_2._8_8_ + 4));
            }
            else {
              std::__cxx11::string::operator+=
                        ((string *)&e.Initialized,(char *)(buffer.field_2._8_8_ + 2));
            }
            cmsys::SystemTools::GetLineFromStream
                      ((istream *)&realbuffer,(string *)((long)&entryKey.field_2 + 8),(bool *)0x0,-1
                      );
            buffer.field_2._8_8_ = std::__cxx11::string::c_str();
            std::ios::operator!((ios *)((long)&realbuffer + *(long *)(realbuffer + -0x18)));
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_358,"HELPSTRING",&local_359);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          CacheEntry::SetProperty((CacheEntry *)local_338,&local_358,pcVar4);
          std::__cxx11::string::~string((string *)&local_358);
          std::allocator<char>::~allocator((allocator<char> *)&local_359);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_380,(char *)buffer.field_2._8_8_,&local_381)
          ;
          bVar1 = ParseEntry(&local_380,(string *)((long)&helpString.field_2 + 8),
                             (string *)local_338,
                             (CacheEntryType *)(e.Value.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_380);
          std::allocator<char>::~allocator((allocator<char> *)&local_381);
          if (bVar1) {
            local_390._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(excludes,(key_type *)((long)&helpString.field_2 + 8));
            local_398._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(excludes);
            bVar1 = std::operator==(&local_390,&local_398);
            if (bVar1) {
              local_679 = true;
              if ((!internal) && (local_679 = true, e.Value.field_2._8_4_ == 4)) {
                local_3a0._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)cacheFile.field_2._8_8_,(key_type *)((long)&helpString.field_2 + 8));
                local_3a8._M_node =
                     (_Base_ptr)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)cacheFile.field_2._8_8_);
                local_679 = std::operator!=(&local_3a0,&local_3a8);
              }
              if (local_679 != false) {
                if (!internal) {
                  e.Value.field_2._8_4_ = 4;
                  std::__cxx11::string::operator=((string *)&e.Initialized,"DO NOT EDIT, ");
                  std::__cxx11::string::operator+=
                            ((string *)&e.Initialized,
                             (string *)(helpString.field_2._M_local_buf + 8));
                  std::__cxx11::string::operator+=
                            ((string *)&e.Initialized,
                             " loaded from external file.  To change this value edit this file: ");
                  std::__cxx11::string::operator+=((string *)&e.Initialized,(string *)path);
                  std::__cxx11::string::operator+=((string *)&e.Initialized,"/CMakeCache.txt");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_3c8,"HELPSTRING",(allocator *)((long)&cmajor + 7));
                  pcVar4 = (char *)std::__cxx11::string::c_str();
                  CacheEntry::SetProperty((CacheEntry *)local_338,&local_3c8,pcVar4);
                  std::__cxx11::string::~string((string *)&local_3c8);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&cmajor + 7));
                }
                bVar1 = ReadPropertyEntry(this,(string *)((long)&helpString.field_2 + 8),
                                          (CacheEntry *)local_338);
                if (!bVar1) {
                  e.Properties.
                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 1;
                  this_00 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                            ::operator[](&this->Cache,(key_type *)((long)&helpString.field_2 + 8));
                  CacheEntry::operator=(this_00,(CacheEntry *)local_338);
                }
              }
            }
          }
          else {
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Error
                      ("Parse error in cache file ",pcVar4,". Offending entry: ",
                       (char *)buffer.field_2._8_8_);
          }
        }
        CacheEntry::~CacheEntry((CacheEntry *)local_338);
        std::__cxx11::string::~string((string *)&e.Initialized);
      }
      this->CacheMajorVersion = 0;
      this->CacheMinorVersion = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&v,"CMAKE_CACHE_MAJOR_VERSION",(allocator *)((long)&cminor + 7));
      pcVar4 = GetInitializedCacheValue(this,(string *)&v);
      std::__cxx11::string::~string((string *)&v);
      std::allocator<char>::~allocator((allocator<char> *)((long)&cminor + 7));
      local_3d8 = pcVar4;
      if (pcVar4 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_450,"CMAKE_CACHE_MINOR_VERSION",&local_451);
        AddCacheEntry(this,&local_450,"0",
                      "Minor version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&local_450);
        std::allocator<char>::~allocator((allocator<char> *)&local_451);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_478,"CMAKE_CACHE_MAJOR_VERSION",(allocator *)((long)&oldDir + 7)
                  );
        AddCacheEntry(this,&local_478,"0",
                      "Major version of cmake used to create the current loaded cache",INTERNAL);
        std::__cxx11::string::~string((string *)&local_478);
        std::allocator<char>::~allocator((allocator<char> *)((long)&oldDir + 7));
      }
      else {
        cminor._0_4_ = 0;
        iVar3 = __isoc99_sscanf(pcVar4,"%u",&cminor);
        if (iVar3 == 1) {
          this->CacheMajorVersion = (uint)cminor;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_428,"CMAKE_CACHE_MINOR_VERSION",&local_429);
        pcVar4 = GetInitializedCacheValue(this,&local_428);
        std::__cxx11::string::~string((string *)&local_428);
        std::allocator<char>::~allocator((allocator<char> *)&local_429);
        local_408 = pcVar4;
        if ((pcVar4 != (char *)0x0) && (iVar3 = __isoc99_sscanf(pcVar4,"%u",&cminor), iVar3 == 1)) {
          this->CacheMinorVersion = (uint)cminor;
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_4a8,"CMAKE_CACHEFILE_DIR",
                 (allocator *)(currentcwd.field_2._M_local_buf + 0xf));
      pcVar4 = GetInitializedCacheValue(this,&local_4a8);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator((allocator<char> *)(currentcwd.field_2._M_local_buf + 0xf));
      local_488 = pcVar4;
      if ((internal) && (pcVar4 != (char *)0x0)) {
        std::__cxx11::string::string((string *)(oldcwd.field_2._M_local_buf + 8),(string *)path);
        pcVar4 = local_488;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_4f0,pcVar4,(allocator *)(message.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
        cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&oldcwd.field_2 + 8));
        std::__cxx11::string::operator+=
                  ((string *)(oldcwd.field_2._M_local_buf + 8),"/CMakeCache.txt");
        std::__cxx11::string::operator+=((string *)local_4f0,"/CMakeCache.txt");
        bVar1 = cmsys::SystemTools::SameFile
                          ((string *)local_4f0,(string *)((long)&oldcwd.field_2 + 8));
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_598,"The current CMakeCache.txt directory ",&local_599);
          std::operator+(&local_578,&local_598,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&oldcwd.field_2 + 8));
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_5c0," is different than the directory ",&local_5c1);
          std::operator+(&local_558,&local_578,&local_5c0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_608,"CMAKE_CACHEFILE_DIR",&local_609);
          pcVar4 = GetInitializedCacheValue(this,&local_608);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_5e8,pcVar4,&local_60a);
          std::operator+(&local_538,&local_558,&local_5e8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_630,
                     " where CMakeCache.txt was created. This may result in binaries being created in the wrong place. If you are not sure, reedit the CMakeCache.txt"
                     ,&local_631);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_518,&local_538,&local_630);
          std::__cxx11::string::~string((string *)&local_630);
          std::allocator<char>::~allocator((allocator<char> *)&local_631);
          std::__cxx11::string::~string((string *)&local_538);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_60a);
          std::__cxx11::string::~string((string *)&local_608);
          std::allocator<char>::~allocator((allocator<char> *)&local_609);
          std::__cxx11::string::~string((string *)&local_558);
          std::__cxx11::string::~string((string *)&local_5c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
          std::__cxx11::string::~string((string *)&local_578);
          std::__cxx11::string::~string((string *)&local_598);
          std::allocator<char>::~allocator((allocator<char> *)&local_599);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error(pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string((string *)local_518);
        }
        std::__cxx11::string::~string((string *)local_4f0);
        std::__cxx11::string::~string((string *)(oldcwd.field_2._M_local_buf + 8));
      }
      this_local._7_1_ = true;
      std::__cxx11::string::~string((string *)(helpString.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(entryKey.field_2._M_local_buf + 8));
    }
    else {
      this_local._7_1_ = false;
    }
    std::ifstream::~ifstream(&realbuffer);
  }
  else {
    CleanCMakeFiles(this,path);
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string(local_58);
  return this_local._7_1_;
}

Assistant:

bool cmCacheManager::LoadCache(const std::string& path,
                               bool internal,
                               std::set<std::string>& excludes,
                               std::set<std::string>& includes)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  // clear the old cache, if we are reading in internal values
  if ( internal )
    {
    this->Cache.clear();
    }
  if(!cmSystemTools::FileExists(cacheFile.c_str()))
    {
    this->CleanCMakeFiles(path);
    return false;
    }

  cmsys::ifstream fin(cacheFile.c_str());
  if(!fin)
    {
    return false;
    }
  const char *realbuffer;
  std::string buffer;
  std::string entryKey;
  while(fin)
    {
    // Format is key:type=value
    std::string helpString;
    CacheEntry e;
    cmSystemTools::GetLineFromStream(fin, buffer);
    realbuffer = buffer.c_str();
    while(*realbuffer != '0' &&
          (*realbuffer == ' ' ||
           *realbuffer == '\t' ||
           *realbuffer == '\r' ||
           *realbuffer == '\n'))
      {
      realbuffer++;
      }
    // skip blank lines and comment lines
    if(realbuffer[0] == '#' || realbuffer[0] == 0)
      {
      continue;
      }
    while(realbuffer[0] == '/' && realbuffer[1] == '/')
      {
      if ((realbuffer[2] == '\\') && (realbuffer[3]=='n'))
        {
        helpString += "\n";
        helpString += &realbuffer[4];
        }
      else
        {
        helpString += &realbuffer[2];
        }
      cmSystemTools::GetLineFromStream(fin, buffer);
      realbuffer = buffer.c_str();
      if(!fin)
        {
        continue;
        }
      }
    e.SetProperty("HELPSTRING", helpString.c_str());
    if(cmCacheManager::ParseEntry(realbuffer, entryKey, e.Value, e.Type))
      {
      if ( excludes.find(entryKey) == excludes.end() )
        {
        // Load internal values if internal is set.
        // If the entry is not internal to the cache being loaded
        // or if it is in the list of internal entries to be
        // imported, load it.
        if ( internal || (e.Type != cmState::INTERNAL) ||
             (includes.find(entryKey) != includes.end()) )
          {
          // If we are loading the cache from another project,
          // make all loaded entries internal so that it is
          // not visible in the gui
          if (!internal)
            {
            e.Type = cmState::INTERNAL;
            helpString = "DO NOT EDIT, ";
            helpString += entryKey;
            helpString += " loaded from external file.  "
              "To change this value edit this file: ";
            helpString += path;
            helpString += "/CMakeCache.txt"   ;
            e.SetProperty("HELPSTRING", helpString.c_str());
            }
          if(!this->ReadPropertyEntry(entryKey, e))
            {
            e.Initialized = true;
            this->Cache[entryKey] = e;
            }
          }
        }
      }
    else
      {
      cmSystemTools::Error("Parse error in cache file ", cacheFile.c_str(),
                           ". Offending entry: ", realbuffer);
      }
    }
  this->CacheMajorVersion = 0;
  this->CacheMinorVersion = 0;
  if(const char* cmajor =
                  this->GetInitializedCacheValue("CMAKE_CACHE_MAJOR_VERSION"))
    {
    unsigned int v=0;
    if(sscanf(cmajor, "%u", &v) == 1)
      {
      this->CacheMajorVersion = v;
      }
    if(const char* cminor =
                  this->GetInitializedCacheValue("CMAKE_CACHE_MINOR_VERSION"))
      {
      if(sscanf(cminor, "%u", &v) == 1)
        {
        this->CacheMinorVersion = v;
        }
      }
    }
  else
    {
    // CMake version not found in the list file.
    // Set as version 0.0
    this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", "0",
                        "Minor version of cmake used to create the "
                        "current loaded cache", cmState::INTERNAL);
    this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", "0",
                        "Major version of cmake used to create the "
                        "current loaded cache", cmState::INTERNAL);

    }
  // check to make sure the cache directory has not
  // been moved
  const char* oldDir = this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
  if (internal && oldDir)
    {
    std::string currentcwd = path;
    std::string oldcwd = oldDir;
    cmSystemTools::ConvertToUnixSlashes(currentcwd);
    currentcwd += "/CMakeCache.txt";
    oldcwd += "/CMakeCache.txt";
    if(!cmSystemTools::SameFile(oldcwd, currentcwd))
      {
      std::string message =
        std::string("The current CMakeCache.txt directory ") +
        currentcwd + std::string(" is different than the directory ") +
        std::string(this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR")) +
        std::string(" where CMakeCache.txt was created. This may result "
                    "in binaries being created in the wrong place. If you "
                    "are not sure, reedit the CMakeCache.txt");
      cmSystemTools::Error(message.c_str());
      }
    }
  return true;
}